

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O1

int __thiscall MlmWrap::addSubToList(MlmWrap *this,HighFreqSub *newSub)

{
  pointer *pppHVar1;
  iterator __position;
  HighFreqSub *local_8;
  
  __position._M_current =
       (this->hfSubs).super__Vector_base<HighFreqSub_*,_std::allocator<HighFreqSub_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->hfSubs).super__Vector_base<HighFreqSub_*,_std::allocator<HighFreqSub_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_8 = newSub;
    std::vector<HighFreqSub*,std::allocator<HighFreqSub*>>::_M_realloc_insert<HighFreqSub*const&>
              ((vector<HighFreqSub*,std::allocator<HighFreqSub*>> *)&this->hfSubs,__position,
               &local_8);
  }
  else {
    *__position._M_current = newSub;
    pppHVar1 = &(this->hfSubs).super__Vector_base<HighFreqSub_*,_std::allocator<HighFreqSub_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppHVar1 = *pppHVar1 + 1;
  }
  return 0;
}

Assistant:

int MlmWrap::addSubToList(HighFreqSub *newSub) {
    hfSubs.push_back(newSub);
    //todo: possibly check for duplicates?
    return(0);
}